

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::InstructionFolder::FoldVectors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          InstructionFolder *this,Op opcode,uint32_t num_dims,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *operands)

{
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_00;
  const_reference ppCVar5;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InstructionFolder *this_01;
  pointer ppCVar7;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operand_values_for_one_dimension;
  uint local_60;
  Op local_5c;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *local_58;
  ulong local_50;
  InstructionFolder local_48;
  long *plVar4;
  
  this_01 = (InstructionFolder *)__return_storage_ptr__;
  local_5c = opcode;
  local_58 = operands;
  bVar2 = IsFoldableOpcode((InstructionFolder *)__return_storage_ptr__,opcode);
  if (!bVar2) {
    __assert_fail("IsFoldableOpcode(opcode) && \"Unhandled instruction opcode in FoldVectors\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x1e0,
                  "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (ulong)num_dims;
  __n = 0;
  do {
    if (__n == local_50) {
      return __return_storage_ptr__;
    }
    local_48.folding_rules_._M_t.
    super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
    .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
            )0x0;
    local_48.context_ = (IRContext *)0x0;
    local_48.const_folding_rules_._M_t.
    super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
    .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>,_true,_true>
          )(__uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
            )0x0;
    ppCVar1 = (local_58->
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar7 = (local_58->
                   super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar1;
        ppCVar7 = ppCVar7 + 1) {
      iVar3 = (*(*ppCVar7)->_vptr_Constant[0x13])();
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar4 == (long *)0x0) {
        iVar3 = (*(*ppCVar7)->_vptr_Constant[0x16])();
        if (CONCAT44(extraout_var_01,iVar3) == 0) {
          __assert_fail("false && \"FoldVectors() only accepts VectorConst or NullConst type of \" \"constant\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                        ,0x201,
                        "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                       );
        }
LAB_004ba1f5:
        local_60 = 0;
        this_01 = &local_48;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_60);
      }
      else {
        this_00 = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)(**(code **)(*plVar4 + 0xc0))(plVar4);
        ppCVar5 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::at(this_00,__n);
        iVar3 = (*(*ppCVar5)->_vptr_Constant[0xd])();
        plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
        if (plVar4 == (long *)0x0) {
          iVar3 = (*(*ppCVar7)->_vptr_Constant[0x16])();
          if (CONCAT44(extraout_var_02,iVar3) == 0) {
            __assert_fail("false && \"VectorConst should only has ScalarConst or NullConst as \" \"components\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                          ,0x1fa,
                          "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                         );
          }
          goto LAB_004ba1f5;
        }
        puVar6 = (undefined8 *)(**(code **)(*plVar4 + 0xc0))(plVar4);
        if (puVar6[1] - (long)*puVar6 != 4) {
          __assert_fail("scalar_words.size() == 1 && \"Vector components with longer than 32-bit width are not allowed \" \"in FoldVectors()\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                        ,499,
                        "std::vector<uint32_t> spvtools::opt::InstructionFolder::FoldVectors(spv::Op, uint32_t, const std::vector<const analysis::Constant *> &) const"
                       );
        }
        this_01 = &local_48;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                   (value_type_conflict1 *)*puVar6);
      }
    }
    local_60 = OperateWords(this_01,local_5c,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,&local_60);
    this_01 = &local_48;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    __n = __n + 1;
  } while( true );
}

Assistant:

std::vector<uint32_t> InstructionFolder::FoldVectors(
    spv::Op opcode, uint32_t num_dims,
    const std::vector<const analysis::Constant*>& operands) const {
  assert(IsFoldableOpcode(opcode) &&
         "Unhandled instruction opcode in FoldVectors");
  std::vector<uint32_t> result;
  for (uint32_t d = 0; d < num_dims; d++) {
    std::vector<uint32_t> operand_values_for_one_dimension;
    for (const auto& operand : operands) {
      if (const analysis::VectorConstant* vector_operand =
              operand->AsVectorConstant()) {
        // Extract the raw value of the scalar component constants
        // in 32-bit words here. The reason of not using FoldScalars() here
        // is that we do not create temporary null constants as components
        // when the vector operand is a NullConstant because Constant creation
        // may need extra checks for the validity and that is not managed in
        // here.
        if (const analysis::ScalarConstant* scalar_component =
                vector_operand->GetComponents().at(d)->AsScalarConstant()) {
          const auto& scalar_words = scalar_component->words();
          assert(
              scalar_words.size() == 1 &&
              "Vector components with longer than 32-bit width are not allowed "
              "in FoldVectors()");
          operand_values_for_one_dimension.push_back(scalar_words.front());
        } else if (operand->AsNullConstant()) {
          operand_values_for_one_dimension.push_back(0u);
        } else {
          assert(false &&
                 "VectorConst should only has ScalarConst or NullConst as "
                 "components");
        }
      } else if (operand->AsNullConstant()) {
        operand_values_for_one_dimension.push_back(0u);
      } else {
        assert(false &&
               "FoldVectors() only accepts VectorConst or NullConst type of "
               "constant");
      }
    }
    result.push_back(OperateWords(opcode, operand_values_for_one_dimension));
  }
  return result;
}